

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O0

MPP_RET mpp_enc_ref_cfg_set_cfg_cnt(MppEncRefCfg ref,RK_S32 lt_cnt,RK_S32 st_cnt)

{
  void *ptr;
  MPP_RET MVar1;
  void *local_38;
  MppEncRefStFrmCfg *st_cfg;
  MppEncRefLtFrmCfg *lt_cfg;
  MppEncRefCfgImpl *p;
  RK_S32 st_cnt_local;
  RK_S32 lt_cnt_local;
  MppEncRefCfg ref_local;
  
  MVar1 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_set_cfg_cnt",ref);
  if (MVar1 == MPP_OK) {
    ptr = *(void **)((long)ref + 0x28);
    local_38 = *(void **)((long)ref + 0x30);
    if ((ptr != (void *)0x0) || (local_38 != (void *)0x0)) {
      _mpp_log_l(2,"mpp_enc_ref","do call reset before setup new cnout\n",
                 "mpp_enc_ref_cfg_set_cfg_cnt");
      if (ptr != (void *)0x0) {
        mpp_osal_free("mpp_enc_ref_cfg_set_cfg_cnt",ptr);
      }
      if (local_38 != (void *)0x0) {
        mpp_osal_free("mpp_enc_ref_cfg_set_cfg_cnt",local_38);
      }
      local_38 = (void *)0x0;
    }
    st_cfg = (MppEncRefStFrmCfg *)0x0;
    if ((lt_cnt != 0) &&
       (st_cfg = (MppEncRefStFrmCfg *)
                 mpp_osal_calloc("mpp_enc_ref_cfg_set_cfg_cnt",(long)lt_cnt * 0x18),
       st_cfg == (MppEncRefStFrmCfg *)0x0)) {
      _mpp_log_l(4,"mpp_enc_ref","failed to create %d lt ref cfg\n","mpp_enc_ref_cfg_set_cfg_cnt",
                 (ulong)(uint)lt_cnt);
    }
    if ((st_cnt != 0) &&
       (local_38 = mpp_osal_calloc("mpp_enc_ref_cfg_set_cfg_cnt",(long)st_cnt * 0x14),
       local_38 == (void *)0x0)) {
      _mpp_log_l(4,"mpp_enc_ref","failed to create %d st ref cfg\n","mpp_enc_ref_cfg_set_cfg_cnt",
                 (ulong)(uint)lt_cnt);
    }
    *(RK_S32 *)((long)ref + 0x14) = lt_cnt;
    *(RK_S32 *)((long)ref + 0x18) = st_cnt;
    *(undefined4 *)((long)ref + 0x1c) = 0;
    *(undefined4 *)((long)ref + 0x20) = 0;
    *(MppEncRefStFrmCfg **)((long)ref + 0x28) = st_cfg;
    *(void **)((long)ref + 0x30) = local_38;
    ref_local._4_4_ = MPP_OK;
  }
  else {
    ref_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  return ref_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_set_cfg_cnt(MppEncRefCfg ref, RK_S32 lt_cnt, RK_S32 st_cnt)
{
    if (check_is_mpp_enc_ref_cfg(ref))
        return MPP_ERR_NULL_PTR;

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)ref;
    MppEncRefLtFrmCfg *lt_cfg = p->lt_cfg;
    MppEncRefStFrmCfg *st_cfg = p->st_cfg;;

    if (lt_cfg || st_cfg) {
        mpp_err_f("do call reset before setup new cnout\n");
        MPP_FREE(lt_cfg);
        MPP_FREE(st_cfg);
    }

    if (lt_cnt) {
        lt_cfg = mpp_calloc(MppEncRefLtFrmCfg, lt_cnt);
        if (NULL == lt_cfg)
            mpp_log_f("failed to create %d lt ref cfg\n", lt_cnt);
    }

    if (st_cnt) {
        st_cfg = mpp_calloc(MppEncRefStFrmCfg, st_cnt);
        if (NULL == st_cfg)
            mpp_log_f("failed to create %d st ref cfg\n", lt_cnt);
    }

    p->max_lt_cfg = lt_cnt;
    p->max_st_cfg = st_cnt;
    p->lt_cfg_cnt = 0;
    p->st_cfg_cnt = 0;
    p->lt_cfg = lt_cfg;
    p->st_cfg = st_cfg;

    return MPP_OK;
}